

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseScript(htmlParserCtxtPtr ctxt)

{
  xmlChar *str1;
  xmlChar *pxVar1;
  int iVar2;
  int local_414;
  int local_410;
  int l;
  int cur;
  int nbchar;
  xmlChar buf [1005];
  htmlParserCtxtPtr ctxt_local;
  
  l = 0;
  if ((500 < (long)ctxt->input->cur - (long)ctxt->input->base) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlParserInputShrink(ctxt->input);
  }
  local_410 = htmlCurrentChar(ctxt,&local_414);
  while (local_410 != 0) {
    if ((local_410 == 0x3c) && (ctxt->input->cur[1] == '/')) {
      if (ctxt->recovery == 0) {
        if (((0x40 < ctxt->input->cur[2]) && (ctxt->input->cur[2] < 0x5b)) ||
           ((0x60 < ctxt->input->cur[2] && (ctxt->input->cur[2] < 0x7b)))) break;
      }
      else {
        str1 = ctxt->name;
        pxVar1 = ctxt->input->cur;
        iVar2 = xmlStrlen(ctxt->name);
        iVar2 = xmlStrncasecmp(str1,pxVar1 + 2,iVar2);
        if (iVar2 == 0) break;
        htmlParseErr(ctxt,XML_ERR_TAG_NAME_MISMATCH,"Element %s embeds close tag\n",ctxt->name,
                     (xmlChar *)0x0);
      }
    }
    if (local_410 < 0x100) {
      if (((8 < local_410) && (local_410 < 0xb)) || ((local_410 == 0xd || (0x1f < local_410))))
      goto LAB_00165756;
LAB_001657b3:
      htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"Invalid char in CDATA 0x%X\n",local_410);
    }
    else {
      if (((local_410 < 0x100) || (0xd7ff < local_410)) &&
         (((local_410 < 0xe000 || (0xfffd < local_410)) &&
          ((local_410 < 0x10000 || (0x10ffff < local_410)))))) goto LAB_001657b3;
LAB_00165756:
      if (local_414 == 1) {
        *(char *)((long)&cur + (long)l) = (char)local_410;
        l = l + 1;
      }
      else {
        iVar2 = xmlCopyChar(local_414,(xmlChar *)((long)&cur + (long)l),local_410);
        l = iVar2 + l;
      }
    }
    if (999 < l) {
      *(undefined1 *)((long)&cur + (long)l) = 0;
      if (ctxt->sax->cdataBlock == (cdataBlockSAXFunc)0x0) {
        if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
          (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)&cur,l);
        }
      }
      else {
        (*ctxt->sax->cdataBlock)(ctxt->userData,(xmlChar *)&cur,l);
      }
      l = 0;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (*ctxt->input->cur == '\n') {
      ctxt->input->line = ctxt->input->line + 1;
      ctxt->input->col = 1;
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
    }
    ctxt->token = 0;
    ctxt->input->cur = ctxt->input->cur + local_414;
    local_410 = htmlCurrentChar(ctxt,&local_414);
  }
  if (((l != 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) && (ctxt->disableSAX == 0)) {
    *(undefined1 *)((long)&cur + (long)l) = 0;
    if (ctxt->sax->cdataBlock == (cdataBlockSAXFunc)0x0) {
      if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
        (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)&cur,l);
      }
    }
    else {
      (*ctxt->sax->cdataBlock)(ctxt->userData,(xmlChar *)&cur,l);
    }
  }
  return;
}

Assistant:

static void
htmlParseScript(htmlParserCtxtPtr ctxt) {
    xmlChar buf[HTML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur,l;

    SHRINK;
    cur = CUR_CHAR(l);
    while (cur != 0) {
	if ((cur == '<') && (NXT(1) == '/')) {
            /*
             * One should break here, the specification is clear:
             * Authors should therefore escape "</" within the content.
             * Escape mechanisms are specific to each scripting or
             * style sheet language.
             *
             * In recovery mode, only break if end tag match the
             * current tag, effectively ignoring all tags inside the
             * script/style block and treating the entire block as
             * CDATA.
             */
            if (ctxt->recovery) {
                if (xmlStrncasecmp(ctxt->name, ctxt->input->cur+2,
				   xmlStrlen(ctxt->name)) == 0)
                {
                    break; /* while */
                } else {
		    htmlParseErr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
				 "Element %s embeds close tag\n",
		                 ctxt->name, NULL);
		}
            } else {
                if (((NXT(2) >= 'A') && (NXT(2) <= 'Z')) ||
                    ((NXT(2) >= 'a') && (NXT(2) <= 'z')))
                {
                    break; /* while */
                }
            }
	}
        if (IS_CHAR(cur)) {
	    COPY_BUF(l,buf,nbchar,cur);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in CDATA 0x%X\n", cur);
        }
	if (nbchar >= HTML_PARSER_BIG_BUFFER_SIZE) {
            buf[nbchar] = 0;
	    if (ctxt->sax->cdataBlock!= NULL) {
		/*
		 * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
		 */
		ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	    } else if (ctxt->sax->characters != NULL) {
		ctxt->sax->characters(ctxt->userData, buf, nbchar);
	    }
	    nbchar = 0;
	}
	GROW;
	NEXTL(l);
	cur = CUR_CHAR(l);
    }

    if ((nbchar != 0) && (ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        buf[nbchar] = 0;
	if (ctxt->sax->cdataBlock!= NULL) {
	    /*
	     * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
	     */
	    ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	} else if (ctxt->sax->characters != NULL) {
	    ctxt->sax->characters(ctxt->userData, buf, nbchar);
	}
    }
}